

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O1

void __thiscall
cmLocalNinjaGenerator::ComputeObjectFilenames
          (cmLocalNinjaGenerator *this,
          map<const_cmSourceFile_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *mapping,cmGeneratorTarget *gt)

{
  char *customOutputExtension;
  _Base_ptr p_Var1;
  _Rb_tree_header *p_Var2;
  bool keptSourceExtension;
  bool local_51;
  string local_50;
  
  customOutputExtension = cmGeneratorTarget::GetCustomObjectExtension(gt);
  p_Var1 = (mapping->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(mapping->_M_t)._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var1 != p_Var2) {
    do {
      cmLocalGenerator::GetObjectFileNameWithoutTarget
                (&local_50,(cmLocalGenerator *)this,*(cmSourceFile **)(p_Var1 + 1),
                 &gt->ObjectDirectory,&local_51,customOutputExtension);
      std::__cxx11::string::operator=((string *)&p_Var1[1]._M_parent,(string *)&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1);
    } while ((_Rb_tree_header *)p_Var1 != p_Var2);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::ComputeObjectFilenames(
  std::map<cmSourceFile const*, std::string>& mapping,
  cmGeneratorTarget const* gt)
{
  // Determine if these object files should use a custom extension
  char const* custom_ext = gt->GetCustomObjectExtension();
  for (std::map<cmSourceFile const*, std::string>::iterator si =
         mapping.begin();
       si != mapping.end(); ++si) {
    cmSourceFile const* sf = si->first;
    bool keptSourceExtension;
    si->second = this->GetObjectFileNameWithoutTarget(
      *sf, gt->ObjectDirectory, &keptSourceExtension, custom_ext);
  }
}